

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall google::protobuf::Descriptor::CopyTo(Descriptor *this,DescriptorProto *proto)

{
  int iVar1;
  int32 iVar2;
  uint uVar3;
  string *initial_value;
  string *psVar4;
  long lVar5;
  Rep *pRVar6;
  OneofDescriptorProto *proto_00;
  DescriptorProto *proto_01;
  EnumDescriptorProto *proto_02;
  DescriptorProto_ExtensionRange *proto_03;
  FieldDescriptorProto *pFVar7;
  DescriptorProto_ReservedRange *pDVar8;
  MessageOptions *pMVar9;
  MessageOptions *pMVar10;
  long lVar11;
  Arena *pAVar12;
  long lVar13;
  
  initial_value = *(string **)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  pAVar12 = (Arena *)(proto->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     .ptr_;
  if (((ulong)pAVar12 & 1) != 0) {
    pAVar12 = *(Arena **)(((ulong)pAVar12 & 0xfffffffffffffffe) + 0x18);
  }
  psVar4 = (proto->name_).ptr_;
  if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance(&proto->name_,pAVar12,initial_value);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar4);
  }
  if (0 < *(int *)(this + 0x68)) {
    lVar13 = 0;
    lVar11 = 0;
    do {
      lVar5 = *(long *)(this + 0x28);
      pRVar6 = (proto->field_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar6 == (Rep *)0x0) {
LAB_002caa10:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(proto->field_).super_RepeatedPtrFieldBase,
                   (proto->field_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002caa1e:
        pRVar6 = (proto->field_).super_RepeatedPtrFieldBase.rep_;
        pRVar6->allocated_size = pRVar6->allocated_size + 1;
        pFVar7 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                           ((proto->field_).super_RepeatedPtrFieldBase.arena_);
        pRVar6 = (proto->field_).super_RepeatedPtrFieldBase.rep_;
        iVar1 = (proto->field_).super_RepeatedPtrFieldBase.current_size_;
        (proto->field_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pRVar6->elements[iVar1] = pFVar7;
      }
      else {
        iVar1 = (proto->field_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar6->allocated_size <= iVar1) {
          if (pRVar6->allocated_size == (proto->field_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_002caa10;
          goto LAB_002caa1e;
        }
        (proto->field_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pFVar7 = (FieldDescriptorProto *)pRVar6->elements[iVar1];
      }
      FieldDescriptor::CopyTo((FieldDescriptor *)(lVar5 + lVar13),pFVar7);
      lVar11 = lVar11 + 1;
      lVar13 = lVar13 + 0x98;
    } while (lVar11 < *(int *)(this + 0x68));
  }
  if (0 < *(int *)(this + 0x6c)) {
    lVar13 = 0;
    lVar11 = 0;
    do {
      lVar5 = *(long *)(this + 0x30);
      pRVar6 = (proto->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar6 == (Rep *)0x0) {
LAB_002caaaf:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(proto->oneof_decl_).super_RepeatedPtrFieldBase,
                   (proto->oneof_decl_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002caac0:
        pRVar6 = (proto->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
        pRVar6->allocated_size = pRVar6->allocated_size + 1;
        proto_00 = Arena::CreateMaybeMessage<google::protobuf::OneofDescriptorProto>
                             ((proto->oneof_decl_).super_RepeatedPtrFieldBase.arena_);
        pRVar6 = (proto->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
        iVar1 = (proto->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
        (proto->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pRVar6->elements[iVar1] = proto_00;
      }
      else {
        iVar1 = (proto->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar6->allocated_size <= iVar1) {
          if (pRVar6->allocated_size == (proto->oneof_decl_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_002caaaf;
          goto LAB_002caac0;
        }
        (proto->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        proto_00 = (OneofDescriptorProto *)pRVar6->elements[iVar1];
      }
      OneofDescriptor::CopyTo((OneofDescriptor *)(lVar5 + lVar13),proto_00);
      lVar11 = lVar11 + 1;
      lVar13 = lVar13 + 0x30;
    } while (lVar11 < *(int *)(this + 0x6c));
  }
  if (0 < *(int *)(this + 0x70)) {
    lVar13 = 0;
    lVar11 = 0;
    do {
      lVar5 = *(long *)(this + 0x38);
      pRVar6 = (proto->nested_type_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar6 == (Rep *)0x0) {
LAB_002cab52:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(proto->nested_type_).super_RepeatedPtrFieldBase,
                   (proto->nested_type_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002cab60:
        pRVar6 = (proto->nested_type_).super_RepeatedPtrFieldBase.rep_;
        pRVar6->allocated_size = pRVar6->allocated_size + 1;
        proto_01 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto>
                             ((proto->nested_type_).super_RepeatedPtrFieldBase.arena_);
        pRVar6 = (proto->nested_type_).super_RepeatedPtrFieldBase.rep_;
        iVar1 = (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_;
        (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pRVar6->elements[iVar1] = proto_01;
      }
      else {
        iVar1 = (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar6->allocated_size <= iVar1) {
          if (pRVar6->allocated_size == (proto->nested_type_).super_RepeatedPtrFieldBase.total_size_
             ) goto LAB_002cab52;
          goto LAB_002cab60;
        }
        (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        proto_01 = (DescriptorProto *)pRVar6->elements[iVar1];
      }
      CopyTo((Descriptor *)(lVar5 + lVar13),proto_01);
      lVar11 = lVar11 + 1;
      lVar13 = lVar13 + 0x90;
    } while (lVar11 < *(int *)(this + 0x70));
  }
  if (0 < *(int *)(this + 0x74)) {
    lVar13 = 0;
    lVar11 = 0;
    do {
      lVar5 = *(long *)(this + 0x40);
      pRVar6 = (proto->enum_type_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar6 == (Rep *)0x0) {
LAB_002cabe2:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(proto->enum_type_).super_RepeatedPtrFieldBase,
                   (proto->enum_type_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002cabf0:
        pRVar6 = (proto->enum_type_).super_RepeatedPtrFieldBase.rep_;
        pRVar6->allocated_size = pRVar6->allocated_size + 1;
        proto_02 = Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto>
                             ((proto->enum_type_).super_RepeatedPtrFieldBase.arena_);
        pRVar6 = (proto->enum_type_).super_RepeatedPtrFieldBase.rep_;
        iVar1 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pRVar6->elements[iVar1] = proto_02;
      }
      else {
        iVar1 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar6->allocated_size <= iVar1) {
          if (pRVar6->allocated_size == (proto->enum_type_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_002cabe2;
          goto LAB_002cabf0;
        }
        (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        proto_02 = (EnumDescriptorProto *)pRVar6->elements[iVar1];
      }
      EnumDescriptor::CopyTo((EnumDescriptor *)(lVar5 + lVar13),proto_02);
      lVar11 = lVar11 + 1;
      lVar13 = lVar13 + 0x50;
    } while (lVar11 < *(int *)(this + 0x74));
  }
  if (0 < *(int *)(this + 0x78)) {
    lVar13 = 0;
    lVar11 = 0;
    do {
      lVar5 = *(long *)(this + 0x48);
      pRVar6 = (proto->extension_range_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar6 == (Rep *)0x0) {
LAB_002cac6f:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(proto->extension_range_).super_RepeatedPtrFieldBase,
                   (proto->extension_range_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002cac7d:
        pRVar6 = (proto->extension_range_).super_RepeatedPtrFieldBase.rep_;
        pRVar6->allocated_size = pRVar6->allocated_size + 1;
        proto_03 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ExtensionRange>
                             ((proto->extension_range_).super_RepeatedPtrFieldBase.arena_);
        pRVar6 = (proto->extension_range_).super_RepeatedPtrFieldBase.rep_;
        iVar1 = (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_;
        (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pRVar6->elements[iVar1] = proto_03;
      }
      else {
        iVar1 = (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar6->allocated_size <= iVar1) {
          if (pRVar6->allocated_size ==
              (proto->extension_range_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002cac6f;
          goto LAB_002cac7d;
        }
        (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        proto_03 = (DescriptorProto_ExtensionRange *)pRVar6->elements[iVar1];
      }
      ExtensionRange::CopyTo((ExtensionRange *)(lVar5 + lVar13),proto_03);
      lVar11 = lVar11 + 1;
      lVar13 = lVar13 + 0x10;
    } while (lVar11 < *(int *)(this + 0x78));
  }
  if (0 < *(int *)(this + 0x7c)) {
    lVar13 = 0;
    lVar11 = 0;
    do {
      lVar5 = *(long *)(this + 0x50);
      pRVar6 = (proto->extension_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar6 == (Rep *)0x0) {
LAB_002cad08:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(proto->extension_).super_RepeatedPtrFieldBase,
                   (proto->extension_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002cad19:
        pRVar6 = (proto->extension_).super_RepeatedPtrFieldBase.rep_;
        pRVar6->allocated_size = pRVar6->allocated_size + 1;
        pFVar7 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                           ((proto->extension_).super_RepeatedPtrFieldBase.arena_);
        pRVar6 = (proto->extension_).super_RepeatedPtrFieldBase.rep_;
        iVar1 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
        (proto->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pRVar6->elements[iVar1] = pFVar7;
      }
      else {
        iVar1 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar6->allocated_size <= iVar1) {
          if (pRVar6->allocated_size == (proto->extension_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_002cad08;
          goto LAB_002cad19;
        }
        (proto->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pFVar7 = (FieldDescriptorProto *)pRVar6->elements[iVar1];
      }
      FieldDescriptor::CopyTo((FieldDescriptor *)(lVar5 + lVar13),pFVar7);
      lVar11 = lVar11 + 1;
      lVar13 = lVar13 + 0x98;
    } while (lVar11 < *(int *)(this + 0x7c));
  }
  if (0 < *(int *)(this + 0x80)) {
    lVar11 = 0;
    do {
      pRVar6 = (proto->reserved_range_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar6 == (Rep *)0x0) {
LAB_002cadb4:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(proto->reserved_range_).super_RepeatedPtrFieldBase,
                   (proto->reserved_range_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002cadc5:
        pRVar6 = (proto->reserved_range_).super_RepeatedPtrFieldBase.rep_;
        pRVar6->allocated_size = pRVar6->allocated_size + 1;
        pDVar8 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ReservedRange>
                           ((proto->reserved_range_).super_RepeatedPtrFieldBase.arena_);
        pRVar6 = (proto->reserved_range_).super_RepeatedPtrFieldBase.rep_;
        iVar1 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
        (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pRVar6->elements[iVar1] = pDVar8;
      }
      else {
        iVar1 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar6->allocated_size <= iVar1) {
          if (pRVar6->allocated_size ==
              (proto->reserved_range_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002cadb4;
          goto LAB_002cadc5;
        }
        (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pDVar8 = (DescriptorProto_ReservedRange *)pRVar6->elements[iVar1];
      }
      lVar13 = *(long *)(this + 0x58);
      iVar2 = *(int32 *)(lVar13 + lVar11 * 8);
      uVar3 = (pDVar8->_has_bits_).has_bits_[0];
      (pDVar8->_has_bits_).has_bits_[0] = uVar3 | 1;
      pDVar8->start_ = iVar2;
      iVar2 = *(int32 *)(lVar13 + 4 + lVar11 * 8);
      (pDVar8->_has_bits_).has_bits_[0] = uVar3 | 3;
      pDVar8->end_ = iVar2;
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)(this + 0x80));
  }
  if (0 < *(int *)(this + 0x84)) {
    lVar11 = 0;
    do {
      DescriptorProto::add_reserved_name(proto,*(string **)(*(long *)(this + 0x60) + lVar11 * 8));
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)(this + 0x84));
  }
  pMVar10 = *(MessageOptions **)(this + 0x20);
  pMVar9 = MessageOptions::default_instance();
  if (pMVar10 != pMVar9) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    if (proto->options_ == (MessageOptions *)0x0) {
      pAVar12 = (Arena *)(proto->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)(((ulong)pAVar12 & 0xfffffffffffffffe) + 0x18);
      }
      pMVar10 = Arena::CreateMaybeMessage<google::protobuf::MessageOptions>(pAVar12);
      proto->options_ = pMVar10;
    }
    MessageOptions::CopyFrom(proto->options_,*(MessageOptions **)(this + 0x20));
    return;
  }
  return;
}

Assistant:

void Descriptor::CopyTo(DescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < field_count(); i++) {
    field(i)->CopyTo(proto->add_field());
  }
  for (int i = 0; i < oneof_decl_count(); i++) {
    oneof_decl(i)->CopyTo(proto->add_oneof_decl());
  }
  for (int i = 0; i < nested_type_count(); i++) {
    nested_type(i)->CopyTo(proto->add_nested_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < extension_range_count(); i++) {
    extension_range(i)->CopyTo(proto->add_extension_range());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    DescriptorProto::ReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &MessageOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}